

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileReader.cpp
# Opt level: O0

AccessorType __thiscall
KeyFileReader<NWN::ResRef16>::GetResourceAccessorName
          (KeyFileReader<NWN::ResRef16> *this,FileHandle File,string *AccessorName)

{
  int iVar1;
  PCKEY_RESOURCE_DESCRIPTOR p_Var2;
  runtime_error *prVar3;
  undefined4 extraout_var;
  string *in_RDX;
  long in_RSI;
  long in_RDI;
  exception anon_var_0;
  AccessorType Type;
  FileHandle FileHandle;
  PCKEY_RESOURCE_DESCRIPTOR ResKey;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  KeyFileReader<NWN::ResRef16> *in_stack_ffffffffffffff98;
  AccessorType local_4;
  long lVar4;
  
  if (in_RSI == 0) {
    std::__cxx11::string::operator=(in_RDX,(string *)(in_RDI + 0x38));
    local_4 = AccessorTypeKey;
  }
  else {
    p_Var2 = LookupResourceKey(in_stack_ffffffffffffff98,
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (p_Var2 == (PCKEY_RESOURCE_DESCRIPTOR)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar3,"invalid file handle passed to KeyFileReader::GetResourceAccessorName");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = (*(p_Var2->BifFile->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor[1])
                      (p_Var2->BifFile,(ulong)((p_Var2->Res).ResID & 0xfffff));
    lVar4 = CONCAT44(extraout_var,iVar1);
    if (lVar4 == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"file open that should not fail has failed");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = (*(p_Var2->BifFile->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor[8]
              )(p_Var2->BifFile,lVar4,in_RDX);
    (*(p_Var2->BifFile->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor[2])
              (p_Var2->BifFile,lVar4);
  }
  return local_4;
}

Assistant:

typename KeyFileReader< ResRefT >::AccessorType
KeyFileReader< ResRefT >::GetResourceAccessorName(
	 FileHandle File,
	 std::string & AccessorName
	)
/*++

Routine Description:

	This routine returns the logical name of the resource accessor.

Arguments:

	File - Supplies the file handle to inquire about.

	AccessorName - Receives the logical name of the resource accessor.

Return Value:

	The routine returns the accessor type.  An std::exception is raised on
	failure.

Environment:

	User mode.

--*/
{
	
	PCKEY_RESOURCE_DESCRIPTOR  ResKey;
	typename BifFileReaderT::FileHandle FileHandle;
	AccessorType               Type;

	if (File == INVALID_FILE)
	{
		AccessorName = m_KeyFileName;
		return AccessorTypeKey;
	}

	//
	// Locate the containing BIF file.
	//

	ResKey = LookupResourceKey( ((ResID) File) - 1 );

	if (ResKey == NULL)
		throw std::runtime_error( "invalid file handle passed to KeyFileReader::GetResourceAccessorName" );

	//
	// Now delegate the query to the specific BIF file that has been chosen.
	//
	// N.B.  File open/close for BIF files is a no-op, so we avoid implementing
	//       an extra handle table indirection level here (as it would only
	//       slow things down).  The file open and close calls are essentially
	//       no-ops.
	//

	FileHandle = ResKey->BifFile->OpenFileByIndex(
		ResKey->Res.ResID & 0xFFFFF );

	if (FileHandle == INVALID_FILE)
		throw std::runtime_error( "file open that should not fail has failed" );

	try
	{
		Type = (AccessorType) ResKey->BifFile->GetResourceAccessorName(
			FileHandle,
			AccessorName);
	}
	catch (std::exception)
	{
		ResKey->BifFile->CloseFile( FileHandle );
		FileHandle = INVALID_FILE;
		throw;
	}

	ResKey->BifFile->CloseFile( FileHandle );
	FileHandle = INVALID_FILE;

	return Type;
}